

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

void Omega_h::find_matches_ex<long>
               (Int deg,LOs *a2fv,Read<int> *av2v,Read<int> *bv2v,Adj *v2b,Write<int> *a2b_out,
               Write<signed_char> *codes_out,bool allow_duplicates)

{
  Adj local_170;
  Read<long> local_140;
  Read<long> local_130;
  Read<int> local_120;
  Adj local_110;
  Read<long> local_e0;
  Read<long> local_d0;
  Read<int> local_c0;
  Adj local_b0;
  Read<long> local_80 [2];
  Read<long> local_60;
  Read<int> local_50;
  byte local_39;
  Write<int> *pWStack_38;
  bool allow_duplicates_local;
  Write<int> *a2b_out_local;
  Adj *v2b_local;
  Read<int> *bv2v_local;
  Read<int> *av2v_local;
  LOs *a2fv_local;
  Int deg_local;
  
  local_39 = allow_duplicates;
  pWStack_38 = a2b_out;
  a2b_out_local = (Write<int> *)v2b;
  v2b_local = (Adj *)bv2v;
  bv2v_local = av2v;
  av2v_local = a2fv;
  a2fv_local._4_4_ = deg;
  if (deg == 2) {
    Read<int>::Read(&local_50,a2fv);
    Read<long>::Read(&local_60,av2v);
    Read<long>::Read(local_80,bv2v);
    Adj::Adj(&local_b0,v2b);
    find_matches_deg<2,long>
              (&local_50,(Read<int> *)&local_60,(Read<int> *)local_80,&local_b0,pWStack_38,codes_out
               ,(bool)(local_39 & 1));
    Adj::~Adj(&local_b0);
    Read<long>::~Read(local_80);
    Read<long>::~Read(&local_60);
    Read<int>::~Read(&local_50);
  }
  else if (deg == 3) {
    Read<int>::Read(&local_c0,a2fv);
    Read<long>::Read(&local_d0,av2v);
    Read<long>::Read(&local_e0,bv2v);
    Adj::Adj(&local_110,v2b);
    find_matches_deg<3,long>
              (&local_c0,(Read<int> *)&local_d0,(Read<int> *)&local_e0,&local_110,pWStack_38,
               codes_out,(bool)(local_39 & 1));
    Adj::~Adj(&local_110);
    Read<long>::~Read(&local_e0);
    Read<long>::~Read(&local_d0);
    Read<int>::~Read(&local_c0);
  }
  else {
    if (deg != 4) {
      fail("find_matches_ex called with unsupported degree %d\n",(ulong)(uint)deg);
    }
    Read<int>::Read(&local_120,a2fv);
    Read<long>::Read(&local_130,av2v);
    Read<long>::Read(&local_140,bv2v);
    Adj::Adj(&local_170,v2b);
    find_matches_deg<4,long>
              (&local_120,(Read<int> *)&local_130,(Read<int> *)&local_140,&local_170,pWStack_38,
               codes_out,(bool)(local_39 & 1));
    Adj::~Adj(&local_170);
    Read<long>::~Read(&local_140);
    Read<long>::~Read(&local_130);
    Read<int>::~Read(&local_120);
  }
  return;
}

Assistant:

void find_matches_ex(Int const deg, LOs const a2fv, Read<T> const av2v,
    Read<T> const bv2v, Adj const v2b, Write<LO>* a2b_out, Write<I8>* codes_out,
    bool const allow_duplicates) {
  if (deg == 2) {
    find_matches_deg<2>(
        a2fv, av2v, bv2v, v2b, a2b_out, codes_out, allow_duplicates);
  } else if (deg == 3) {
    find_matches_deg<3>(
        a2fv, av2v, bv2v, v2b, a2b_out, codes_out, allow_duplicates);
  } else if (deg == 4) {
    find_matches_deg<4>(
        a2fv, av2v, bv2v, v2b, a2b_out, codes_out, allow_duplicates);
  } else {
    Omega_h_fail("find_matches_ex called with unsupported degree %d\n", deg);
  }
}